

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_end_to_end_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_170746b::RTEndToEndTest::SetUp(RTEndToEndTest *this)

{
  libaom_test::EncoderTest::InitializeConfig(&this->super_EncoderTest,kRealTime);
  (this->super_EncoderTest).cfg_.g_threads = this->threads_;
  (this->super_EncoderTest).cfg_.rc_buf_sz = 1000;
  (this->super_EncoderTest).cfg_.rc_buf_initial_sz = 500;
  (this->super_EncoderTest).cfg_.rc_buf_optimal_sz = 600;
  (this->super_EncoderTest).cfg_.kf_min_dist = 9999;
  (this->super_EncoderTest).cfg_.kf_max_dist = 9999;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(::libaom_test::kRealTime);

    cfg_.g_threads = threads_;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 600;
    cfg_.kf_max_dist = 9999;
    cfg_.kf_min_dist = 9999;
  }